

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

void __thiscall
google::protobuf::io::FileOutputStream::CopyingFileOutputStream::~CopyingFileOutputStream
          (CopyingFileOutputStream *this)

{
  bool bVar1;
  LogMessage *pLVar2;
  char *local_38 [2];
  LogMessage local_28;
  Voidify local_11;
  CopyingFileOutputStream *local_10;
  CopyingFileOutputStream *this_local;
  
  local_10 = this;
  if (((this->close_on_delete_ & 1U) != 0) && (bVar1 = Close(this), !bVar1)) {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl.cc"
               ,0xac);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_28);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [17])"close() failed: ");
    local_38[0] = strerror(this->errno_);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<<char_*,_0>(pLVar2,local_38);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_11,pLVar2);
    absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_28);
  }
  CopyingOutputStream::~CopyingOutputStream(&this->super_CopyingOutputStream);
  return;
}

Assistant:

FileOutputStream::CopyingFileOutputStream::~CopyingFileOutputStream() {
  if (close_on_delete_) {
    if (!Close()) {
      ABSL_LOG(ERROR) << "close() failed: " << strerror(errno_);
    }
  }
}